

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

void __thiscall
CCallMethodExp::CCallMethodExp
          (CCallMethodExp *this,IExpression *_objectExpression,CIdExp *_methodName,CExpList *_args)

{
  int iVar1;
  unique_ptr<CExpList,_std::default_delete<CExpList>_> local_40;
  unique_ptr<CIdExp,_std::default_delete<CIdExp>_> local_38;
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_30;
  CExpList *local_28;
  CExpList *_args_local;
  CIdExp *_methodName_local;
  IExpression *_objectExpression_local;
  CCallMethodExp *this_local;
  
  local_28 = _args;
  _args_local = (CExpList *)_methodName;
  _methodName_local = (CIdExp *)_objectExpression;
  _objectExpression_local = &this->super_IExpression;
  IExpression::IExpression((IExpression *)this);
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00236f60;
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->objectExpression);
  std::unique_ptr<CIdExp,std::default_delete<CIdExp>>::unique_ptr<std::default_delete<CIdExp>,void>
            ((unique_ptr<CIdExp,std::default_delete<CIdExp>> *)&this->methodName);
  std::unique_ptr<CExpList,std::default_delete<CExpList>>::
  unique_ptr<std::default_delete<CExpList>,void>
            ((unique_ptr<CExpList,std::default_delete<CExpList>> *)&this->args);
  iVar1 = (_args_local->super_IExpression).super_PositionedNode.position.lastLine;
  (this->super_IExpression).super_PositionedNode.position.firstLine =
       (_args_local->super_IExpression).super_PositionedNode.position.firstLine;
  (this->super_IExpression).super_PositionedNode.position.lastLine = iVar1;
  iVar1 = (_args_local->super_IExpression).super_PositionedNode.position.lastColumn;
  (this->super_IExpression).super_PositionedNode.position.firstColumn =
       (_args_local->super_IExpression).super_PositionedNode.position.firstColumn;
  (this->super_IExpression).super_PositionedNode.position.lastColumn = iVar1;
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&local_30,
             &_methodName_local->super_IExpression);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->objectExpression,&local_30);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(&local_30);
  std::unique_ptr<CIdExp,std::default_delete<CIdExp>>::unique_ptr<std::default_delete<CIdExp>,void>
            ((unique_ptr<CIdExp,std::default_delete<CIdExp>> *)&local_38,(pointer)_args_local);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator=(&this->methodName,&local_38);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::~unique_ptr(&local_38);
  std::unique_ptr<CExpList,std::default_delete<CExpList>>::
  unique_ptr<std::default_delete<CExpList>,void>
            ((unique_ptr<CExpList,std::default_delete<CExpList>> *)&local_40,local_28);
  std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::operator=(&this->args,&local_40);
  std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::~unique_ptr(&local_40);
  return;
}

Assistant:

CCallMethodExp::CCallMethodExp( IExpression* _objectExpression, CIdExp *_methodName, CExpList *_args ) {
    this->position = _methodName->position;
    objectExpression = std::unique_ptr<IExpression>(_objectExpression);
    methodName = std::unique_ptr<CIdExp>( _methodName );
    args = std::unique_ptr<CExpList>( _args );
}